

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O0

int __thiscall
soul::ModuleCloner::clone
          (ModuleCloner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Module *this_00;
  Expression *pEVar1;
  ReturnValue *pRVar2;
  ReturnValue *old_local;
  ModuleCloner *this_local;
  
  this_00 = this->newModule;
  pEVar1 = pool_ref::operator_cast_to_Expression_((pool_ref *)(__fn + 0x18));
  pEVar1 = cloneExpression(this,pEVar1);
  pRVar2 = Module::allocate<soul::heart::ReturnValue,soul::heart::Expression&>(this_00,pEVar1);
  return (int)pRVar2;
}

Assistant:

heart::ReturnValue& clone (const heart::ReturnValue& old)
    {
        return newModule.allocate<heart::ReturnValue> (cloneExpression (old.returnValue));
    }